

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O0

lzma_ret lzma_index_cat(lzma_index *dest,lzma_index *src,lzma_allocator *allocator)

{
  index_tree_node *piVar1;
  index_tree_node *__src;
  uint32_t uVar2;
  lzma_vli lVar3;
  lzma_vli lVar4;
  lzma_vli lVar5;
  undefined1 local_80 [8];
  index_cat_info info;
  index_group *newg;
  index_group *g;
  index_stream *s;
  lzma_vli src_size;
  lzma_vli dest_size;
  lzma_vli dest_file_size;
  lzma_allocator *allocator_local;
  lzma_index *src_local;
  lzma_index *dest_local;
  
  lVar3 = lzma_index_file_size(dest);
  lVar4 = lzma_index_file_size(src);
  if ((lVar3 + lVar4 < 0x8000000000000000) &&
     (dest->uncompressed_size + src->uncompressed_size < 0x8000000000000000)) {
    lVar4 = index_size_unpadded(dest->record_count,dest->index_list_size);
    lVar5 = index_size_unpadded(src->record_count,src->index_list_size);
    lVar4 = vli_ceil4(lVar4 + lVar5);
    if (lVar4 < 0x400000001) {
      piVar1 = (dest->streams).rightmost;
      __src = piVar1[1].right;
      if ((__src != (index_tree_node *)0x0) &&
         ((undefined1 *)((long)&(__src[1].parent)->uncompressed_base + 1U) <
          (undefined1 *)__src[1].compressed_base)) {
        if (__src->left != (index_tree_node *)0x0) {
          __assert_fail("g->node.left == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                        ,799,
                        "lzma_ret lzma_index_cat(lzma_index *restrict, lzma_index *restrict, const lzma_allocator *)"
                       );
        }
        if (__src->right != (index_tree_node *)0x0) {
          __assert_fail("g->node.right == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                        ,800,
                        "lzma_ret lzma_index_cat(lzma_index *restrict, lzma_index *restrict, const lzma_allocator *)"
                       );
        }
        info.streams = (index_tree *)
                       lzma_alloc((long)((long)&(__src[1].parent)->uncompressed_base + 1) * 0x10 +
                                  0x40,allocator);
        if (info.streams == (index_tree *)0x0) {
          return LZMA_MEM_ERROR;
        }
        memcpy(info.streams,__src,0x28);
        info.streams[1].rightmost =
             (index_tree_node *)((long)&(__src[1].parent)->uncompressed_base + 1);
        *(index_tree_node **)&info.streams[1].count = __src[1].parent;
        info.streams[1].leftmost = (index_tree_node *)__src[1].uncompressed_base;
        memcpy(info.streams + 2,&__src[1].left,(long)info.streams[1].rightmost << 4);
        if (__src->parent != (index_tree_node *)0x0) {
          if (__src->parent->right != __src) {
            __assert_fail("g->node.parent->right == &g->node",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                          ,0x332,
                          "lzma_ret lzma_index_cat(lzma_index *restrict, lzma_index *restrict, const lzma_allocator *)"
                         );
          }
          __src->parent->right = (index_tree_node *)info.streams;
        }
        if (piVar1[1].left == __src) {
          if (piVar1[1].parent != __src) {
            __assert_fail("s->groups.root == &g->node",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                          ,0x337,
                          "lzma_ret lzma_index_cat(lzma_index *restrict, lzma_index *restrict, const lzma_allocator *)"
                         );
          }
          piVar1[1].left = (index_tree_node *)info.streams;
          piVar1[1].parent = (index_tree_node *)info.streams;
        }
        if (piVar1[1].right != __src) {
          __assert_fail("s->groups.rightmost == &g->node",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                        ,0x33c,
                        "lzma_ret lzma_index_cat(lzma_index *restrict, lzma_index *restrict, const lzma_allocator *)"
                       );
        }
        piVar1[1].right = (index_tree_node *)info.streams;
        lzma_free(__src,allocator);
      }
      local_80 = (undefined1  [8])dest->uncompressed_size;
      info.file_size = dest->record_count;
      info.block_number_add._0_4_ = (dest->streams).count;
      info.uncompressed_size = lVar3;
      info._24_8_ = dest;
      index_cat_helper((index_cat_info *)local_80,(index_stream *)(src->streams).root);
      dest->uncompressed_size = src->uncompressed_size + dest->uncompressed_size;
      dest->total_size = src->total_size + dest->total_size;
      dest->record_count = src->record_count + dest->record_count;
      dest->index_list_size = src->index_list_size + dest->index_list_size;
      uVar2 = lzma_index_checks(dest);
      dest->checks = uVar2 | src->checks;
      lzma_free(src,allocator);
      dest_local._4_4_ = LZMA_OK;
    }
    else {
      dest_local._4_4_ = LZMA_DATA_ERROR;
    }
  }
  else {
    dest_local._4_4_ = LZMA_DATA_ERROR;
  }
  return dest_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_index_cat(lzma_index *restrict dest, lzma_index *restrict src,
		const lzma_allocator *allocator)
{
	const lzma_vli dest_file_size = lzma_index_file_size(dest);

	// Check that we don't exceed the file size limits.
	if (dest_file_size + lzma_index_file_size(src) > LZMA_VLI_MAX
			|| dest->uncompressed_size + src->uncompressed_size
				> LZMA_VLI_MAX)
		return LZMA_DATA_ERROR;

	// Check that the encoded size of the combined lzma_indexes stays
	// within limits. In theory, this should be done only if we know
	// that the user plans to actually combine the Streams and thus
	// construct a single Index (probably rare). However, exceeding
	// this limit is quite theoretical, so we do this check always
	// to simplify things elsewhere.
	{
		const lzma_vli dest_size = index_size_unpadded(
				dest->record_count, dest->index_list_size);
		const lzma_vli src_size = index_size_unpadded(
				src->record_count, src->index_list_size);
		if (vli_ceil4(dest_size + src_size) > LZMA_BACKWARD_SIZE_MAX)
			return LZMA_DATA_ERROR;
	}

	// Optimize the last group to minimize memory usage. Allocation has
	// to be done before modifying dest or src.
	{
		index_stream *s = (index_stream *)(dest->streams.rightmost);
		index_group *g = (index_group *)(s->groups.rightmost);
		if (g != NULL && g->last + 1 < g->allocated) {
			assert(g->node.left == NULL);
			assert(g->node.right == NULL);

			index_group *newg = lzma_alloc(sizeof(index_group)
					+ (g->last + 1)
					* sizeof(index_record),
					allocator);
			if (newg == NULL)
				return LZMA_MEM_ERROR;

			newg->node = g->node;
			newg->allocated = g->last + 1;
			newg->last = g->last;
			newg->number_base = g->number_base;

			memcpy(newg->records, g->records, newg->allocated
					* sizeof(index_record));

			if (g->node.parent != NULL) {
				assert(g->node.parent->right == &g->node);
				g->node.parent->right = &newg->node;
			}

			if (s->groups.leftmost == &g->node) {
				assert(s->groups.root == &g->node);
				s->groups.leftmost = &newg->node;
				s->groups.root = &newg->node;
			}

			assert(s->groups.rightmost == &g->node);
			s->groups.rightmost = &newg->node;

			lzma_free(g, allocator);

			// NOTE: newg isn't leaked here because
			// newg == (void *)&newg->node.
		}
	}

	// Add all the Streams from src to dest. Update the base offsets
	// of each Stream from src.
	const index_cat_info info = {
		.uncompressed_size = dest->uncompressed_size,
		.file_size = dest_file_size,
		.stream_number_add = dest->streams.count,
		.block_number_add = dest->record_count,
		.streams = &dest->streams,
	};
	index_cat_helper(&info, (index_stream *)(src->streams.root));

	// Update info about all the combined Streams.
	dest->uncompressed_size += src->uncompressed_size;
	dest->total_size += src->total_size;
	dest->record_count += src->record_count;
	dest->index_list_size += src->index_list_size;
	dest->checks = lzma_index_checks(dest) | src->checks;

	// There's nothing else left in src than the base structure.
	lzma_free(src, allocator);

	return LZMA_OK;
}